

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

EndianKind __thiscall llvm::ARM::parseArchEndian(ARM *this,StringRef Arch)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = Arch.Data;
  if (pcVar3 < (char *)0x5) {
    bVar1 = true;
    if (pcVar3 < (char *)0x3) {
      return INVALID;
    }
  }
  else {
    iVar2 = bcmp(this,"armeb",5);
    if (iVar2 == 0) {
      return BIG;
    }
    bVar1 = true;
    if ((char *)0x6 < pcVar3) {
      iVar2 = bcmp(this,"thumbeb",7);
      if (iVar2 == 0) {
        return BIG;
      }
      if (((char *)0x9 < pcVar3) && (iVar2 = bcmp(this,"aarch64_be",10), iVar2 == 0)) {
        return BIG;
      }
      bVar1 = false;
    }
  }
  iVar2 = bcmp(this,"arm",3);
  if ((iVar2 != 0) && ((pcVar3 < (char *)0x5 || (iVar2 = bcmp(this,"thumb",5), iVar2 != 0)))) {
    if (bVar1) {
      return INVALID;
    }
    iVar2 = bcmp(this,"aarch64",7);
    return (uint)(iVar2 == 0);
  }
  iVar2 = bcmp(this + (long)pcVar3 + -2,"eb",2);
  return (iVar2 == 0) + LITTLE;
}

Assistant:

ARM::EndianKind ARM::parseArchEndian(StringRef Arch) {
  if (Arch.startswith("armeb") || Arch.startswith("thumbeb") ||
      Arch.startswith("aarch64_be"))
    return ARM::EndianKind::BIG;

  if (Arch.startswith("arm") || Arch.startswith("thumb")) {
    if (Arch.endswith("eb"))
      return ARM::EndianKind::BIG;
    else
      return ARM::EndianKind::LITTLE;
  }

  if (Arch.startswith("aarch64"))
    return ARM::EndianKind::LITTLE;

  return ARM::EndianKind::INVALID;
}